

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaccard.cpp
# Opt level: O0

void duckdb::JaccardFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_8_1_6971b95b fun;
  reference count;
  Vector *in_RDX;
  DataChunk *in_RDI;
  value_type *tgt_vec;
  value_type *str_vec;
  size_type in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  Vector *result_00;
  reference left;
  
  fun.result = vector<duckdb::Vector,_true>::operator[]
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  result_00 = in_RDX;
  left = count;
  DataChunk::size(in_RDI);
  BinaryExecutor::
  Execute<duckdb::string_t,duckdb::string_t,double,duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
            (left,in_RDX,result_00,(idx_t)count,fun);
  return;
}

Assistant:

static void JaccardFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, double>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return JaccardScalarFunction(result, str, tgt); });
}